

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printT2AddrModeImm8Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  int iVar5;
  MCOperand *op;
  MCOperand *op_00;
  char *pcVar6;
  ulong uVar7;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op);
  pcVar6 = (*pcVar2->get_regname)(uVar4);
  SStream_concat0(O,pcVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar4 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
  }
  uVar7 = MCOperand_getImm(op_00);
  iVar5 = (int)uVar7;
  uVar7 = uVar7 & 0xffffffff;
  if (iVar5 < 0) {
    uVar7 = (ulong)(uint)-iVar5;
    pcVar6 = ", #-0x%x";
  }
  else {
    if (iVar5 < 1 && !AlwaysPrintImm0) goto LAB_001677dc;
    if (iVar5 < 10) {
      pcVar6 = ", #%u";
    }
    else {
      pcVar6 = ", #0x%x";
    }
  }
  SStream_concat(O,pcVar6,uVar7,(ulong)(uint)-iVar5);
LAB_001677dc:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    *(int *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x52) = iVar5;
  }
  SStream_concat0(O,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printT2AddrModeImm8Operand(MCInst *MI, unsigned OpNum, SStream *O,
		bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	SStream_concat0(O, "[");
	set_mem_access(MI, true);

	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;
	// Don't print +0.
	if (OffImm == INT32_MIN)
		OffImm = 0;

	if (isSub)
		SStream_concat(O, ", #-0x%x", -OffImm);
	else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm > HEX_THRESHOLD)
			SStream_concat(O, ", #0x%x", OffImm);
		else
			SStream_concat(O, ", #%u", OffImm);
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}